

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

Value * __thiscall
BasicBlock::UpdateValueForCopyTypeInstr
          (BasicBlock *this,GlobOpt *globOpt,GlobHashTable *localSymToValueMap,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  int32 intConst;
  undefined8 in_RAX;
  undefined4 *puVar3;
  SymOpnd *pSVar4;
  PropertySym *pPVar5;
  Value *pVVar6;
  StackSym *pSVar7;
  Value **ppVVar8;
  Sym *pSVar9;
  IntConstOpnd *this_00;
  Int64ConstOpnd *pIVar10;
  AddrOpnd *addrOpnd;
  undefined8 uStack_38;
  ValueType src1Value;
  
  if (instr->m_opcode != LdFld) {
    uStack_38 = in_RAX;
    pSVar7 = IR::Opnd::GetStackSym(instr->m_src1);
    if (pSVar7 == (StackSym *)0x0) {
      bVar2 = IR::Opnd::IsIntConstOpnd(instr->m_src1);
      if (bVar2) {
        pSVar9 = IR::Opnd::GetSym(instr->m_dst);
        ppVVar8 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
        this_00 = IR::Opnd::AsIntConstOpnd(instr->m_src1);
        intConst = IR::IntConstOpnd::AsInt32(this_00);
        pVVar6 = GlobOpt::GetIntConstantValue(globOpt,intConst,instr,(Opnd *)0x0);
      }
      else {
        bVar2 = IR::Opnd::IsInt64ConstOpnd(instr->m_src1);
        if (bVar2) {
          pSVar9 = IR::Opnd::GetSym(instr->m_dst);
          ppVVar8 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
          pIVar10 = IR::Opnd::AsInt64ConstOpnd(instr->m_src1);
          pVVar6 = GlobOpt::GetIntConstantValue
                             (globOpt,(pIVar10->super_EncodableOpnd<long>).m_value,instr,(Opnd *)0x0
                             );
        }
        else {
          uStack_38 = CONCAT26((instr->m_src1->m_valueType).field_0.bits,(undefined6)uStack_38);
          pSVar9 = IR::Opnd::GetSym(instr->m_dst);
          ppVVar8 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,pSVar9);
          bVar2 = ValueType::IsUndefined((ValueType *)((long)&uStack_38 + 6));
          if ((bVar2) || (bVar2 = ValueType::IsBoolean((ValueType *)((long)&uStack_38 + 6)), bVar2))
          {
            addrOpnd = IR::Opnd::AsAddrOpnd(instr->m_src1);
            pVVar6 = GlobOpt::GetVarConstantValue(globOpt,addrOpnd);
          }
          else {
            pVVar6 = (Value *)0x0;
          }
        }
      }
      *ppVVar8 = pVVar6;
      return pVVar6;
    }
    pPVar5 = (PropertySym *)IR::Opnd::GetStackSym(instr->m_src1);
    pSVar7 = (StackSym *)IR::Opnd::GetSym(instr->m_dst);
LAB_003ff66b:
    pVVar6 = FindValueInLocalThenGlobalValueTableAndUpdate
                       (this,globOpt,localSymToValueMap,instr,&pSVar7->super_Sym,&pPVar5->super_Sym)
    ;
    return pVVar6;
  }
  bVar2 = IR::Opnd::IsSymOpnd(instr->m_src1);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x11e9,"(instr->GetSrc1()->IsSymOpnd())","instr->GetSrc1()->IsSymOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pSVar4 = IR::Opnd::AsSymOpnd(instr->m_src1);
  if (pSVar4->m_sym->m_kind == SymKindProperty) {
    pPVar5 = Sym::AsPropertySym(pSVar4->m_sym);
    pVVar6 = FindValueInLocalThenGlobalValueTableAndUpdate
                       (this,globOpt,localSymToValueMap,instr,(Sym *)0x0,
                        &pPVar5->m_stackSym->super_Sym);
    if ((pVVar6 == (Value *)0x0) ||
       (pSVar7 = (StackSym *)pVVar6->valueInfo->symStore, pSVar7 == (StackSym *)0x0)) {
      pSVar7 = pPVar5->m_stackSym;
    }
    pPVar5 = PropertySym::Find((pSVar7->super_Sym).m_id,pPVar5->m_propertyId,globOpt->func);
    pSVar7 = IR::Opnd::GetStackSym(instr->m_dst);
    if (pPVar5 != (PropertySym *)0x0) goto LAB_003ff66b;
    ppVVar8 = ValueHashTable<Sym_*,_Value_*>::FindOrInsertNew(localSymToValueMap,&pSVar7->super_Sym)
    ;
    *ppVVar8 = (Value *)0x0;
  }
  return (Value *)0x0;
}

Assistant:

Value*
BasicBlock::UpdateValueForCopyTypeInstr(GlobOpt* globOpt, GlobHashTable* localSymToValueMap, IR::Instr* instr)
{
    Value* dstValue = nullptr;
    if (instr->m_opcode == Js::OpCode::LdFld)
    {
        // Special handling for LdFld
        Assert(instr->GetSrc1()->IsSymOpnd());
        IR::SymOpnd* symOpnd = instr->GetSrc1()->AsSymOpnd();

        if (symOpnd->m_sym->IsPropertySym())
        {
            PropertySym* originalPropertySym = symOpnd->m_sym->AsPropertySym();
            Value* const objectValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, nullptr, originalPropertySym->m_stackSym);
            Sym* objSym = objectValue ? objectValue->GetValueInfo()->GetSymStore() : nullptr;
            PropertySym* prop = PropertySym::Find(objSym ? objSym->m_id : originalPropertySym->m_stackSym->m_id, originalPropertySym->m_propertyId, globOpt->func);
            if (prop)
            {
                dstValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, instr->GetDst()->GetStackSym(), prop);
            }
            else
            {
                Value** localDstValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetStackSym());
                dstValue = *localDstValue = nullptr;
            }
        }
    }
    else if (instr->GetSrc1()->GetStackSym())
    {
        StackSym* src1Sym = instr->GetSrc1()->GetStackSym();
        dstValue = FindValueInLocalThenGlobalValueTableAndUpdate(globOpt, localSymToValueMap, instr, instr->GetDst()->GetSym(), src1Sym);
    }
    else if (instr->GetSrc1()->IsIntConstOpnd())
    {
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        dstValue = *localValue = globOpt->GetIntConstantValue(instr->GetSrc1()->AsIntConstOpnd()->AsInt32(), instr);
    }
    else if (instr->GetSrc1()->IsInt64ConstOpnd())
    {
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        dstValue = *localValue = globOpt->GetIntConstantValue(instr->GetSrc1()->AsInt64ConstOpnd()->GetValue(), instr);
    }
    else
    {
        ValueType src1Value = instr->GetSrc1()->GetValueType();
        Value** localValue = localSymToValueMap->FindOrInsertNew(instr->GetDst()->GetSym());
        if (src1Value.IsUndefined() || src1Value.IsBoolean())
        {
            dstValue = *localValue = globOpt->GetVarConstantValue(instr->GetSrc1()->AsAddrOpnd());
        }
        else
        {
            dstValue = *localValue = nullptr;
        }
    }
    return dstValue;
}